

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

void duckdb::FindForeignKeyInformation
               (TableCatalogEntry *table,AlterForeignKeyType alter_fk_type,
               vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
               *fk_arrays)

{
  ForeignKeyType FVar1;
  int iVar2;
  undefined4 extraout_var;
  const_reference this;
  pointer pCVar3;
  ForeignKeyConstraint *pFVar4;
  string *psVar5;
  CatalogException *this_00;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *this_01;
  AlterForeignKeyType alter_fk_type_local;
  long *local_148;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *local_140;
  TableCatalogEntry *local_138;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>>
  *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  Catalog *local_120;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  AlterEntryData alter_data;
  string local_50;
  
  this_01 = &table->constraints;
  alter_fk_type_local = alter_fk_type;
  local_130 = (vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>>
               *)fk_arrays;
  iVar2 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0xb])();
  local_120 = (Catalog *)CONCAT44(extraout_var,iVar2);
  local_128 = &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name;
  __n = 0;
  local_140 = this_01;
  local_138 = table;
  do {
    if ((ulong)((long)(table->constraints).
                      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(table->constraints).
                      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return;
    }
    this = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
           ::get<true>(this_01,__n);
    pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this);
    if (pCVar3->type == FOREIGN_KEY) {
      pCVar3 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this);
      pFVar4 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar3);
      FVar1 = (pFVar4->info).type;
      if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
        psVar5 = Catalog::GetName_abi_cxx11_(local_120);
        ::std::__cxx11::string::string((string *)&local_118,(string *)psVar5);
        ::std::__cxx11::string::string((string *)&local_d8,(string *)&(pFVar4->info).schema);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&(pFVar4->info).table);
        AlterEntryData::AlterEntryData(&alter_data,&local_118,&local_d8,&local_50,THROW_EXCEPTION);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_118);
        make_uniq<duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::PhysicalIndex,true>&,duckdb::vector<duckdb::PhysicalIndex,true>&,duckdb::AlterForeignKeyType&>
                  ((duckdb *)&local_148,&alter_data,local_128,&pFVar4->pk_columns,
                   &pFVar4->fk_columns,&(pFVar4->info).pk_keys,&(pFVar4->info).fk_keys,
                   &alter_fk_type_local);
        ::std::
        vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,std::default_delete<duckdb::AlterForeignKeyInfo>,true>>
                  (local_130,
                   (unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
                    *)&local_148);
        table = local_138;
        this_01 = local_140;
        if (local_148 != (long *)0x0) {
          (**(code **)(*local_148 + 8))();
        }
        AlterEntryData::~AlterEntryData(&alter_data);
      }
      else if ((FVar1 == FK_TYPE_PRIMARY_KEY_TABLE) && (alter_fk_type_local == AFT_DELETE)) {
        this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&alter_data,
                   "Could not drop the table because this table is main key table of the table \"%s\""
                   ,(allocator *)&local_148);
        ::std::__cxx11::string::string((string *)&local_f8,(string *)&(pFVar4->info).table);
        CatalogException::CatalogException<std::__cxx11::string>
                  (this_00,&alter_data.catalog,&local_f8);
        __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

static void FindForeignKeyInformation(TableCatalogEntry &table, AlterForeignKeyType alter_fk_type,
                                      vector<unique_ptr<AlterForeignKeyInfo>> &fk_arrays) {
	auto &constraints = table.GetConstraints();
	auto &catalog = table.ParentCatalog();
	auto &name = table.name;
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto &cond = constraints[i];
		if (cond->type != ConstraintType::FOREIGN_KEY) {
			continue;
		}
		auto &fk = cond->Cast<ForeignKeyConstraint>();
		if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
			AlterEntryData alter_data(catalog.GetName(), fk.info.schema, fk.info.table,
			                          OnEntryNotFound::THROW_EXCEPTION);
			fk_arrays.push_back(make_uniq<AlterForeignKeyInfo>(std::move(alter_data), name, fk.pk_columns,
			                                                   fk.fk_columns, fk.info.pk_keys, fk.info.fk_keys,
			                                                   alter_fk_type));
		} else if (fk.info.type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE &&
		           alter_fk_type == AlterForeignKeyType::AFT_DELETE) {
			throw CatalogException("Could not drop the table because this table is main key table of the table \"%s\"",
			                       fk.info.table);
		}
	}
}